

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O1

void extend_params(dill_stream_conflict s,int argno)

{
  size_t sVar1;
  private_ctx pdVar2;
  dill_reg **ppdVar3;
  arg_info_list paVar4;
  dill_parameter_type **ppdVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = s->p->c_param_count;
  if (iVar8 == 0) {
    sVar1 = (long)argno * 8 + 0x10;
    ppdVar3 = (dill_reg **)dill_malloc(sVar1);
    s->p->c_param_regs = ppdVar3;
    paVar4 = (arg_info_list)dill_malloc(((long)argno * 4 + 8) * 5);
    s->p->c_param_args = paVar4;
    ppdVar5 = (dill_parameter_type **)dill_malloc(sVar1);
  }
  else {
    if (argno + 1 < iVar8) goto LAB_00106e4a;
    sVar1 = (long)argno * 8 + 0x10;
    ppdVar3 = (dill_reg **)dill_realloc(s->p->c_param_regs,sVar1);
    pdVar2 = s->p;
    pdVar2->c_param_regs = ppdVar3;
    paVar4 = (arg_info_list)dill_realloc(pdVar2->c_param_args,((long)argno * 4 + 8) * 5);
    pdVar2 = s->p;
    pdVar2->c_param_args = paVar4;
    ppdVar5 = (dill_parameter_type **)dill_realloc(pdVar2->c_param_structs,sVar1);
  }
  s->p->c_param_structs = ppdVar5;
LAB_00106e4a:
  iVar8 = s->p->c_param_count;
  lVar6 = (long)iVar8;
  if (iVar8 <= argno) {
    lVar7 = lVar6 * 0x14;
    iVar8 = (argno - iVar8) + 1;
    do {
      s->p->c_param_regs[lVar6] = (dill_reg *)0x0;
      pdVar2 = s->p;
      paVar4 = pdVar2->c_param_args;
      *(undefined2 *)(&paVar4->type + lVar7) = 0xb;
      (&paVar4->is_immediate)[lVar7] = '\0';
      *(undefined8 *)((long)&paVar4->in_reg + lVar7) = 0;
      *(undefined4 *)((long)&paVar4->offset + lVar7) = 0;
      pdVar2->c_param_structs[lVar6] = (dill_parameter_type *)0x0;
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x14;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  s->p->c_param_count = argno + 1;
  return;
}

Assistant:

static void
extend_params(dill_stream s, int argno)
{
    int i;
    if (s->p->c_param_count == 0) {
        s->p->c_param_regs =
            malloc(sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args =
            malloc(sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            malloc(sizeof(s->p->c_param_structs[0]) * (argno + 2));
    } else if (s->p->c_param_count <= (argno + 1)) {
        s->p->c_param_regs = realloc(
            s->p->c_param_regs, sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args = realloc(
            s->p->c_param_args, sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            realloc(s->p->c_param_structs,
                    sizeof(s->p->c_param_structs[0]) * (argno + 2));
    }
    for (i = s->p->c_param_count; i <= argno; i++) {
        s->p->c_param_regs[i] = NULL;
        s->p->c_param_args[i].type = DILL_V;
        s->p->c_param_args[i].is_register = 0;
        s->p->c_param_args[i].is_immediate = 0;
        s->p->c_param_args[i].in_reg = 0;
        s->p->c_param_args[i].out_reg = 0;
        s->p->c_param_args[i].offset = 0;
        s->p->c_param_structs[i] = NULL;
    }
    s->p->c_param_count = (argno + 1);
}